

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCShapeProfileDef,_6UL>::Construct
                   (DB *db,LIST *params)

{
  IfcParameterizedProfileDef *this;
  
  this = (IfcParameterizedProfileDef *)operator_new(0xd8);
  this[1].super_IfcProfileDef.ProfileName.ptr._M_string_length = (size_type)&PTR__Object_008048a0;
  this[1].super_IfcProfileDef.ProfileName.ptr.field_2._M_allocated_capacity = 0;
  *(char **)((long)&this[1].super_IfcProfileDef.ProfileName.ptr.field_2 + 8) = "IfcCShapeProfileDef"
  ;
  Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (this,&PTR_construction_vtable_24__0081f8c8);
  *(undefined8 *)&this->field_0x78 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcCShapeProfileDef_0081f838;
  this[1].super_IfcProfileDef.ProfileName.ptr._M_string_length =
       (size_type)&PTR__IfcCShapeProfileDef_0081f8b0;
  *(undefined ***)&(this->super_IfcProfileDef).field_0x58 = &PTR__IfcCShapeProfileDef_0081f860;
  *(undefined ***)&this->field_0x70 = &PTR__IfcCShapeProfileDef_0081f888;
  this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  field_0x20 = 0;
  *(undefined1 *)&this[1].super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(this->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }